

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlink-ipi.c
# Opt level: O1

mraa_board_t * mraa_lec_al_board(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  mraa_board_t *board;
  FILE *__stream;
  __ssize_t _Var4;
  size_t sVar5;
  char *pcVar6;
  mraa_pininfo_t *pmVar7;
  mraa_adv_func_t *pmVar8;
  ssize_t sVar9;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  char *line;
  size_t len;
  char buffer [60];
  char *local_a8;
  uint local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_88;
  size_t local_80;
  char local_78 [72];
  
  local_78[0x30] = '\0';
  local_78[0x31] = '\0';
  local_78[0x32] = '\0';
  local_78[0x33] = '\0';
  local_78[0x34] = '\0';
  local_78[0x35] = '\0';
  local_78[0x36] = '\0';
  local_78[0x37] = '\0';
  local_78[0x38] = '\0';
  local_78[0x39] = '\0';
  local_78[0x3a] = '\0';
  local_78[0x3b] = '\0';
  local_78[0x20] = '\0';
  local_78[0x21] = '\0';
  local_78[0x22] = '\0';
  local_78[0x23] = '\0';
  local_78[0x24] = '\0';
  local_78[0x25] = '\0';
  local_78[0x26] = '\0';
  local_78[0x27] = '\0';
  local_78[0x28] = '\0';
  local_78[0x29] = '\0';
  local_78[0x2a] = '\0';
  local_78[0x2b] = '\0';
  local_78[0x2c] = '\0';
  local_78[0x2d] = '\0';
  local_78[0x2e] = '\0';
  local_78[0x2f] = '\0';
  local_78[0x10] = '\0';
  local_78[0x11] = '\0';
  local_78[0x12] = '\0';
  local_78[0x13] = '\0';
  local_78[0x14] = '\0';
  local_78[0x15] = '\0';
  local_78[0x16] = '\0';
  local_78[0x17] = '\0';
  local_78[0x18] = '\0';
  local_78[0x19] = '\0';
  local_78[0x1a] = '\0';
  local_78[0x1b] = '\0';
  local_78[0x1c] = '\0';
  local_78[0x1d] = '\0';
  local_78[0x1e] = '\0';
  local_78[0x1f] = '\0';
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  local_a8 = (char *)0x0;
  board = (mraa_board_t *)calloc(1,0x5f0);
  if (board == (mraa_board_t *)0x0) {
    return (mraa_board_t *)0x0;
  }
  __stream = fopen("/sys/devices/virtual/dmi/id/product_name","r");
  if (__stream == (FILE *)0x0) {
    uVar10 = 0xffffffff;
  }
  else {
    _Var4 = getline(&local_a8,&local_80,__stream);
    pcVar6 = local_a8;
    if (_Var4 == -1) {
      uVar10 = 0xffffffff;
    }
    else {
      sVar5 = strcspn(local_a8,"\r\n");
      pcVar12 = local_a8;
      pcVar6[sVar5] = '\0';
      iVar1 = strncasecmp(local_a8,"LEC-AL-AI",10);
      if (iVar1 == 0) {
        uVar10 = 1;
        pcVar6 = "LEC-AL AI";
      }
      else {
        iVar1 = strncasecmp(pcVar12,"LEC-ALAI",9);
        uVar10 = (uint)(iVar1 == 0);
        pcVar6 = "LEC-AL";
        if (iVar1 == 0) {
          pcVar6 = "LEC-AL AI";
        }
      }
      board->platform_name = pcVar6;
    }
    fclose(__stream);
  }
  board->phy_pin_count = 0x29;
  board->gpio_count = 0x11;
  board->chardev_capable = 0;
  pmVar7 = (mraa_pininfo_t *)malloc(0x7914);
  board->pins = pmVar7;
  if (pmVar7 == (mraa_pininfo_t *)0x0) {
LAB_0012110c:
    syslog(2,"lec_al: Platform failed to initialise");
    free(board);
    close(_fd);
    return (mraa_board_t *)0x0;
  }
  pmVar8 = (mraa_adv_func_t *)calloc(1,0x288);
  board->adv_func = pmVar8;
  if (pmVar8 == (mraa_adv_func_t *)0x0) {
    free(pmVar7);
    goto LAB_0012110c;
  }
  pmVar8->gpio_isr_replace = gpio_isr_replace;
  pmVar8->gpio_close_pre = gpio_close_pre;
  pmVar8->gpio_init_pre = gpio_init_pre;
  pmVar8->pwm_init_raw_replace = pwm_init_raw_replace;
  pmVar8->pwm_period_replace = pwm_period_replace;
  pmVar8->pwm_read_replace = pwm_read_replace;
  pmVar8->pwm_write_replace = pwm_write_replace;
  pmVar8->pwm_enable_replace = pwm_enable_replace;
  uVar11 = 0;
  local_9c = uVar10;
  do {
    snprintf(local_78,0x3c,"/sys/class/gpio/gpiochip%d/device/name",(ulong)uVar11);
    iVar1 = open(local_78,0);
    if (iVar1 != -1) {
      sVar9 = read(iVar1,local_78,7);
      iVar3 = (int)sVar9;
      if (iVar3 != 0) {
        iVar2 = strncmp(local_78,"sx1509q",(long)iVar3);
        if (iVar2 == 0) {
          base2 = uVar11;
        }
        iVar3 = strncmp(local_78,"pca9535",(long)iVar3);
        if (iVar3 == 0) {
          base1 = uVar11;
        }
      }
      close(iVar1);
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 999);
  syslog(5,"lec_al: base1 %d base2 %d\n",(ulong)(uint)base1);
  board->pwm_dev_count = 0;
  board->pwm_default_period = 5000;
  board->pwm_max_period = 0x35555;
  board->pwm_min_period = 1;
  if (1 < board->phy_pin_count) {
    pmVar7 = board->pins;
    pmVar7[1].name[8] = '\0';
    pmVar7[1].name[9] = '\0';
    pmVar7[1].name[10] = '\0';
    pmVar7[1].name[0xb] = '\0';
    pmVar7[1].name[0] = '3';
    pmVar7[1].name[1] = 'v';
    pmVar7[1].name[2] = '3';
    pmVar7[1].name[3] = '\0';
    pmVar7[1].name[4] = '\0';
    pmVar7[1].name[5] = '\0';
    pmVar7[1].name[6] = '\0';
    pmVar7[1].name[7] = '\0';
    *(undefined1 *)&pmVar7[1].capabilities = 1;
    pmVar7[1].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[1].capabilities.field_0x1 = 0;
  }
  if (2 < board->phy_pin_count) {
    pmVar7 = board->pins;
    pmVar7[2].name[8] = '\0';
    pmVar7[2].name[9] = '\0';
    pmVar7[2].name[10] = '\0';
    pmVar7[2].name[0xb] = '\0';
    pmVar7[2].name[0] = '5';
    pmVar7[2].name[1] = 'v';
    pmVar7[2].name[2] = '\0';
    pmVar7[2].name[3] = '\0';
    pmVar7[2].name[4] = '\0';
    pmVar7[2].name[5] = '\0';
    pmVar7[2].name[6] = '\0';
    pmVar7[2].name[7] = '\0';
    *(undefined1 *)&pmVar7[2].capabilities = 1;
    pmVar7[2].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[2].capabilities.field_0x1 = 0;
  }
  if (3 < board->phy_pin_count) {
    pmVar7 = board->pins;
    pmVar7[3].name[8] = '\0';
    pmVar7[3].name[9] = '\0';
    pmVar7[3].name[10] = '\0';
    pmVar7[3].name[0xb] = '\0';
    pmVar7[3].name[0] = 'I';
    pmVar7[3].name[1] = '2';
    pmVar7[3].name[2] = 'C';
    pmVar7[3].name[3] = '0';
    pmVar7[3].name[4] = '_';
    pmVar7[3].name[5] = 'D';
    pmVar7[3].name[6] = 'A';
    pmVar7[3].name[7] = 'T';
    *(undefined1 *)&pmVar7[3].capabilities = 0x21;
    pmVar7[3].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[3].capabilities.field_0x1 = 0;
    pmVar7[3].i2c.pinmap = 1;
    pmVar7[3].i2c.mux_total = 0;
  }
  if (4 < board->phy_pin_count) {
    pmVar7 = board->pins;
    pmVar7[4].name[8] = '\0';
    pmVar7[4].name[9] = '\0';
    pmVar7[4].name[10] = '\0';
    pmVar7[4].name[0xb] = '\0';
    pmVar7[4].name[0] = '5';
    pmVar7[4].name[1] = 'v';
    pmVar7[4].name[2] = '\0';
    pmVar7[4].name[3] = '\0';
    pmVar7[4].name[4] = '\0';
    pmVar7[4].name[5] = '\0';
    pmVar7[4].name[6] = '\0';
    pmVar7[4].name[7] = '\0';
    *(undefined1 *)&pmVar7[4].capabilities = 1;
    pmVar7[4].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[4].capabilities.field_0x1 = 0;
  }
  if (5 < board->phy_pin_count) {
    pmVar7 = board->pins;
    pmVar7[5].name[8] = '\0';
    pmVar7[5].name[9] = '\0';
    pmVar7[5].name[10] = '\0';
    pmVar7[5].name[0xb] = '\0';
    pmVar7[5].name[0] = 'I';
    pmVar7[5].name[1] = '2';
    pmVar7[5].name[2] = 'C';
    pmVar7[5].name[3] = '0';
    pmVar7[5].name[4] = '_';
    pmVar7[5].name[5] = 'C';
    pmVar7[5].name[6] = 'K';
    pmVar7[5].name[7] = '\0';
    *(undefined1 *)&pmVar7[5].capabilities = 0x21;
    pmVar7[5].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[5].capabilities.field_0x1 = 0;
    pmVar7[5].i2c.pinmap = 1;
    pmVar7[5].i2c.mux_total = 0;
  }
  if (6 < board->phy_pin_count) {
    pmVar7 = board->pins;
    pmVar7[6].name[8] = '\0';
    pmVar7[6].name[9] = '\0';
    pmVar7[6].name[10] = '\0';
    pmVar7[6].name[0xb] = '\0';
    pmVar7[6].name[0] = 'G';
    pmVar7[6].name[1] = 'N';
    pmVar7[6].name[2] = 'D';
    pmVar7[6].name[3] = '\0';
    pmVar7[6].name[4] = '\0';
    pmVar7[6].name[5] = '\0';
    pmVar7[6].name[6] = '\0';
    pmVar7[6].name[7] = '\0';
    *(undefined1 *)&pmVar7[6].capabilities = 1;
    pmVar7[6].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[6].capabilities.field_0x1 = 0;
  }
  if (7 < board->phy_pin_count) {
    iVar1 = base1 + 4;
    pmVar7 = board->pins;
    pmVar7[7].name[8] = '\0';
    pmVar7[7].name[9] = '\0';
    pmVar7[7].name[10] = '\0';
    pmVar7[7].name[0xb] = '\0';
    pmVar7[7].name[0] = 'G';
    pmVar7[7].name[1] = 'P';
    pmVar7[7].name[2] = 'I';
    pmVar7[7].name[3] = 'O';
    pmVar7[7].name[4] = '0';
    pmVar7[7].name[5] = '4';
    pmVar7[7].name[6] = '\0';
    pmVar7[7].name[7] = '\0';
    *(undefined1 *)&pmVar7[7].capabilities = 3;
    pmVar7[7].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[7].capabilities.field_0x1 = 0;
    pmVar7[7].gpio.pinmap = iVar1;
    pmVar7[7].gpio.mux_total = 0;
  }
  if (8 < board->phy_pin_count) {
    pmVar7 = board->pins;
    pmVar7[8].name[8] = '\0';
    pmVar7[8].name[9] = '\0';
    pmVar7[8].name[10] = '\0';
    pmVar7[8].name[0xb] = '\0';
    pmVar7[8].name[0] = 'U';
    pmVar7[8].name[1] = 'A';
    pmVar7[8].name[2] = 'R';
    pmVar7[8].name[3] = 'T';
    pmVar7[8].name[4] = '_';
    pmVar7[8].name[5] = 'T';
    pmVar7[8].name[6] = 'X';
    pmVar7[8].name[7] = 'D';
    *(undefined1 *)&pmVar7[8].capabilities = 0x81;
    pmVar7[8].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[8].capabilities.field_0x1 = 0;
    pmVar7[8].uart.mux_total = 0;
  }
  if (9 < board->phy_pin_count) {
    pmVar7 = board->pins;
    pmVar7[9].name[8] = '\0';
    pmVar7[9].name[9] = '\0';
    pmVar7[9].name[10] = '\0';
    pmVar7[9].name[0xb] = '\0';
    pmVar7[9].name[0] = 'G';
    pmVar7[9].name[1] = 'N';
    pmVar7[9].name[2] = 'D';
    pmVar7[9].name[3] = '\0';
    pmVar7[9].name[4] = '\0';
    pmVar7[9].name[5] = '\0';
    pmVar7[9].name[6] = '\0';
    pmVar7[9].name[7] = '\0';
    *(undefined1 *)&pmVar7[9].capabilities = 1;
    pmVar7[9].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[9].capabilities.field_0x1 = 0;
  }
  if (10 < board->phy_pin_count) {
    pmVar7 = board->pins;
    pmVar7[10].name[8] = '\0';
    pmVar7[10].name[9] = '\0';
    pmVar7[10].name[10] = '\0';
    pmVar7[10].name[0xb] = '\0';
    pmVar7[10].name[0] = 'U';
    pmVar7[10].name[1] = 'A';
    pmVar7[10].name[2] = 'R';
    pmVar7[10].name[3] = 'T';
    pmVar7[10].name[4] = '_';
    pmVar7[10].name[5] = 'R';
    pmVar7[10].name[6] = 'X';
    pmVar7[10].name[7] = 'D';
    *(undefined1 *)&pmVar7[10].capabilities = 0x81;
    pmVar7[10].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[10].capabilities.field_0x1 = 0;
    pmVar7[10].uart.mux_total = 0;
  }
  if (0xb < board->phy_pin_count) {
    iVar1 = base1 + 6;
    pmVar7 = board->pins;
    pmVar7[0xb].name[8] = '\0';
    pmVar7[0xb].name[9] = '\0';
    pmVar7[0xb].name[10] = '\0';
    pmVar7[0xb].name[0xb] = '\0';
    pmVar7[0xb].name[0] = 'G';
    pmVar7[0xb].name[1] = 'P';
    pmVar7[0xb].name[2] = 'I';
    pmVar7[0xb].name[3] = 'O';
    pmVar7[0xb].name[4] = '0';
    pmVar7[0xb].name[5] = '5';
    pmVar7[0xb].name[6] = '\0';
    pmVar7[0xb].name[7] = '\0';
    *(undefined1 *)&pmVar7[0xb].capabilities = 3;
    pmVar7[0xb].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0xb].capabilities.field_0x1 = 0;
    pmVar7[0xb].gpio.pinmap = iVar1;
    pmVar7[0xb].gpio.mux_total = 0;
  }
  if (0xc < board->phy_pin_count) {
    iVar1 = base1 + 5;
    pmVar7 = board->pins;
    pmVar7[0xc].name[8] = '\0';
    pmVar7[0xc].name[9] = '\0';
    pmVar7[0xc].name[10] = '\0';
    pmVar7[0xc].name[0xb] = '\0';
    pmVar7[0xc].name[0] = 'G';
    pmVar7[0xc].name[1] = 'P';
    pmVar7[0xc].name[2] = 'I';
    pmVar7[0xc].name[3] = 'O';
    pmVar7[0xc].name[4] = '0';
    pmVar7[0xc].name[5] = '6';
    pmVar7[0xc].name[6] = '\0';
    pmVar7[0xc].name[7] = '\0';
    *(undefined1 *)&pmVar7[0xc].capabilities = 3;
    pmVar7[0xc].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0xc].capabilities.field_0x1 = 0;
    pmVar7[0xc].gpio.pinmap = iVar1;
    pmVar7[0xc].gpio.mux_total = 0;
  }
  pmVar7 = board->pins;
  pmVar7[0xc].pwm.pinmap = 9;
  pmVar7[0xc].pwm.parent_id = 0;
  board->pwm_dev_count = board->pwm_dev_count + 1;
  if (0xd < board->phy_pin_count) {
    iVar1 = base1 + 7;
    pmVar7[0xd].name[8] = '\0';
    pmVar7[0xd].name[9] = '\0';
    pmVar7[0xd].name[10] = '\0';
    pmVar7[0xd].name[0xb] = '\0';
    pmVar7[0xd].name[0] = 'G';
    pmVar7[0xd].name[1] = 'P';
    pmVar7[0xd].name[2] = 'I';
    pmVar7[0xd].name[3] = 'O';
    pmVar7[0xd].name[4] = '0';
    pmVar7[0xd].name[5] = '7';
    pmVar7[0xd].name[6] = '\0';
    pmVar7[0xd].name[7] = '\0';
    *(undefined1 *)&pmVar7[0xd].capabilities = 3;
    pmVar7[0xd].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0xd].capabilities.field_0x1 = 0;
    pmVar7[0xd].gpio.pinmap = iVar1;
    pmVar7[0xd].gpio.mux_total = 0;
  }
  if (0xe < board->phy_pin_count) {
    pmVar7 = board->pins;
    pmVar7[0xe].name[8] = '\0';
    pmVar7[0xe].name[9] = '\0';
    pmVar7[0xe].name[10] = '\0';
    pmVar7[0xe].name[0xb] = '\0';
    pmVar7[0xe].name[0] = 'G';
    pmVar7[0xe].name[1] = 'N';
    pmVar7[0xe].name[2] = 'D';
    pmVar7[0xe].name[3] = '\0';
    pmVar7[0xe].name[4] = '\0';
    pmVar7[0xe].name[5] = '\0';
    pmVar7[0xe].name[6] = '\0';
    pmVar7[0xe].name[7] = '\0';
    *(undefined1 *)&pmVar7[0xe].capabilities = 1;
    pmVar7[0xe].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0xe].capabilities.field_0x1 = 0;
  }
  if (0xf < board->phy_pin_count) {
    iVar1 = base1 + 8;
    pmVar7 = board->pins;
    pmVar7[0xf].name[8] = '\0';
    pmVar7[0xf].name[9] = '\0';
    pmVar7[0xf].name[10] = '\0';
    pmVar7[0xf].name[0xb] = '\0';
    pmVar7[0xf].name[0] = 'G';
    pmVar7[0xf].name[1] = 'P';
    pmVar7[0xf].name[2] = 'I';
    pmVar7[0xf].name[3] = 'O';
    pmVar7[0xf].name[4] = '0';
    pmVar7[0xf].name[5] = '8';
    pmVar7[0xf].name[6] = '\0';
    pmVar7[0xf].name[7] = '\0';
    *(undefined1 *)&pmVar7[0xf].capabilities = 3;
    pmVar7[0xf].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0xf].capabilities.field_0x1 = 0;
    pmVar7[0xf].gpio.pinmap = iVar1;
    pmVar7[0xf].gpio.mux_total = 0;
  }
  if (0x10 < board->phy_pin_count) {
    iVar1 = base1 + 9;
    pmVar7 = board->pins;
    pmVar7[0x10].name[8] = '\0';
    pmVar7[0x10].name[9] = '\0';
    pmVar7[0x10].name[10] = '\0';
    pmVar7[0x10].name[0xb] = '\0';
    pmVar7[0x10].name[0] = 'G';
    pmVar7[0x10].name[1] = 'P';
    pmVar7[0x10].name[2] = 'I';
    pmVar7[0x10].name[3] = 'O';
    pmVar7[0x10].name[4] = '0';
    pmVar7[0x10].name[5] = '9';
    pmVar7[0x10].name[6] = '\0';
    pmVar7[0x10].name[7] = '\0';
    *(undefined1 *)&pmVar7[0x10].capabilities = 3;
    pmVar7[0x10].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x10].capabilities.field_0x1 = 0;
    pmVar7[0x10].gpio.pinmap = iVar1;
    pmVar7[0x10].gpio.mux_total = 0;
  }
  if (0x11 < board->phy_pin_count) {
    pmVar7 = board->pins;
    pmVar7[0x11].name[8] = '\0';
    pmVar7[0x11].name[9] = '\0';
    pmVar7[0x11].name[10] = '\0';
    pmVar7[0x11].name[0xb] = '\0';
    pmVar7[0x11].name[0] = '3';
    pmVar7[0x11].name[1] = 'v';
    pmVar7[0x11].name[2] = '3';
    pmVar7[0x11].name[3] = '\0';
    pmVar7[0x11].name[4] = '\0';
    pmVar7[0x11].name[5] = '\0';
    pmVar7[0x11].name[6] = '\0';
    pmVar7[0x11].name[7] = '\0';
    *(undefined1 *)&pmVar7[0x11].capabilities = 1;
    pmVar7[0x11].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x11].capabilities.field_0x1 = 0;
  }
  if (0x12 < board->phy_pin_count) {
    iVar1 = base1 + 10;
    pmVar7 = board->pins;
    pmVar7[0x12].name[8] = '\0';
    pmVar7[0x12].name[9] = '\0';
    pmVar7[0x12].name[10] = '\0';
    pmVar7[0x12].name[0xb] = '\0';
    pmVar7[0x12].name[0] = 'G';
    pmVar7[0x12].name[1] = 'P';
    pmVar7[0x12].name[2] = 'I';
    pmVar7[0x12].name[3] = 'O';
    pmVar7[0x12].name[4] = '1';
    pmVar7[0x12].name[5] = '0';
    pmVar7[0x12].name[6] = '\0';
    pmVar7[0x12].name[7] = '\0';
    *(undefined1 *)&pmVar7[0x12].capabilities = 3;
    pmVar7[0x12].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x12].capabilities.field_0x1 = 0;
    pmVar7[0x12].gpio.pinmap = iVar1;
    pmVar7[0x12].gpio.mux_total = 0;
  }
  if (0x13 < board->phy_pin_count) {
    pmVar7 = board->pins;
    pmVar7[0x13].name[0] = 'S';
    pmVar7[0x13].name[1] = 'P';
    pmVar7[0x13].name[2] = 'I';
    pmVar7[0x13].name[3] = '_';
    pmVar7[0x13].name[4] = '0';
    pmVar7[0x13].name[5] = '_';
    pmVar7[0x13].name[6] = 'M';
    pmVar7[0x13].name[7] = 'O';
    pmVar7[0x13].name[8] = 'S';
    pmVar7[0x13].name[9] = 'I';
    pmVar7[0x13].name[10] = '\0';
    pmVar7[0x13].name[0xb] = '\0';
    *(undefined1 *)&pmVar7[0x13].capabilities = 0x11;
    pmVar7[0x13].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x13].capabilities.field_0x1 = 0;
    pmVar7[0x13].spi.mux_total = 0;
  }
  if (0x14 < board->phy_pin_count) {
    pmVar7 = board->pins;
    pmVar7[0x14].name[8] = '\0';
    pmVar7[0x14].name[9] = '\0';
    pmVar7[0x14].name[10] = '\0';
    pmVar7[0x14].name[0xb] = '\0';
    pmVar7[0x14].name[0] = 'G';
    pmVar7[0x14].name[1] = 'N';
    pmVar7[0x14].name[2] = 'D';
    pmVar7[0x14].name[3] = '\0';
    pmVar7[0x14].name[4] = '\0';
    pmVar7[0x14].name[5] = '\0';
    pmVar7[0x14].name[6] = '\0';
    pmVar7[0x14].name[7] = '\0';
    *(undefined1 *)&pmVar7[0x14].capabilities = 1;
    pmVar7[0x14].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x14].capabilities.field_0x1 = 0;
  }
  if (0x15 < board->phy_pin_count) {
    pmVar7 = board->pins;
    pmVar7[0x15].name[0] = 'S';
    pmVar7[0x15].name[1] = 'P';
    pmVar7[0x15].name[2] = 'I';
    pmVar7[0x15].name[3] = '_';
    pmVar7[0x15].name[4] = '0';
    pmVar7[0x15].name[5] = '_';
    pmVar7[0x15].name[6] = 'M';
    pmVar7[0x15].name[7] = 'I';
    pmVar7[0x15].name[8] = 'S';
    pmVar7[0x15].name[9] = 'O';
    pmVar7[0x15].name[10] = '\0';
    pmVar7[0x15].name[0xb] = '\0';
    *(undefined1 *)&pmVar7[0x15].capabilities = 0x11;
    pmVar7[0x15].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x15].capabilities.field_0x1 = 0;
    pmVar7[0x15].spi.mux_total = 0;
  }
  if (0x16 < board->phy_pin_count) {
    iVar1 = base1 + 0xb;
    pmVar7 = board->pins;
    pmVar7[0x16].name[8] = '\0';
    pmVar7[0x16].name[9] = '\0';
    pmVar7[0x16].name[10] = '\0';
    pmVar7[0x16].name[0xb] = '\0';
    pmVar7[0x16].name[0] = 'G';
    pmVar7[0x16].name[1] = 'P';
    pmVar7[0x16].name[2] = 'I';
    pmVar7[0x16].name[3] = 'O';
    pmVar7[0x16].name[4] = '1';
    pmVar7[0x16].name[5] = '1';
    pmVar7[0x16].name[6] = '\0';
    pmVar7[0x16].name[7] = '\0';
    *(undefined1 *)&pmVar7[0x16].capabilities = 3;
    pmVar7[0x16].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x16].capabilities.field_0x1 = 0;
    pmVar7[0x16].gpio.pinmap = iVar1;
    pmVar7[0x16].gpio.mux_total = 0;
  }
  if (0x17 < board->phy_pin_count) {
    pmVar7 = board->pins;
    pmVar7[0x17].name[0] = 'S';
    pmVar7[0x17].name[1] = 'P';
    pmVar7[0x17].name[2] = 'I';
    pmVar7[0x17].name[3] = '_';
    pmVar7[0x17].name[4] = '0';
    pmVar7[0x17].name[5] = '_';
    pmVar7[0x17].name[6] = 'S';
    pmVar7[0x17].name[7] = 'C';
    pmVar7[0x17].name[8] = 'L';
    pmVar7[0x17].name[9] = 'K';
    pmVar7[0x17].name[10] = '\0';
    pmVar7[0x17].name[0xb] = '\0';
    *(undefined1 *)&pmVar7[0x17].capabilities = 0x11;
    pmVar7[0x17].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x17].capabilities.field_0x1 = 0;
    pmVar7[0x17].spi.mux_total = 0;
  }
  if (0x18 < board->phy_pin_count) {
    pmVar7 = board->pins;
    pmVar7[0x18].name[0] = 'S';
    pmVar7[0x18].name[1] = 'P';
    pmVar7[0x18].name[2] = 'I';
    pmVar7[0x18].name[3] = '_';
    pmVar7[0x18].name[4] = '0';
    pmVar7[0x18].name[5] = '_';
    pmVar7[0x18].name[6] = 'C';
    pmVar7[0x18].name[7] = 'E';
    pmVar7[0x18].name[8] = '0';
    pmVar7[0x18].name[9] = '\0';
    pmVar7[0x18].name[10] = '\0';
    pmVar7[0x18].name[0xb] = '\0';
    *(undefined1 *)&pmVar7[0x18].capabilities = 0x11;
    pmVar7[0x18].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x18].capabilities.field_0x1 = 0;
    pmVar7[0x18].spi.mux_total = 0;
  }
  if (0x19 < board->phy_pin_count) {
    pmVar7 = board->pins;
    pmVar7[0x19].name[8] = '\0';
    pmVar7[0x19].name[9] = '\0';
    pmVar7[0x19].name[10] = '\0';
    pmVar7[0x19].name[0xb] = '\0';
    pmVar7[0x19].name[0] = 'G';
    pmVar7[0x19].name[1] = 'N';
    pmVar7[0x19].name[2] = 'D';
    pmVar7[0x19].name[3] = '\0';
    pmVar7[0x19].name[4] = '\0';
    pmVar7[0x19].name[5] = '\0';
    pmVar7[0x19].name[6] = '\0';
    pmVar7[0x19].name[7] = '\0';
    *(undefined1 *)&pmVar7[0x19].capabilities = 1;
    pmVar7[0x19].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x19].capabilities.field_0x1 = 0;
  }
  if (0x1a < board->phy_pin_count) {
    pmVar7 = board->pins;
    pmVar7[0x1a].name[0] = 'S';
    pmVar7[0x1a].name[1] = 'P';
    pmVar7[0x1a].name[2] = 'I';
    pmVar7[0x1a].name[3] = '_';
    pmVar7[0x1a].name[4] = '0';
    pmVar7[0x1a].name[5] = '_';
    pmVar7[0x1a].name[6] = 'C';
    pmVar7[0x1a].name[7] = 'E';
    pmVar7[0x1a].name[8] = '1';
    pmVar7[0x1a].name[9] = '\0';
    pmVar7[0x1a].name[10] = '\0';
    pmVar7[0x1a].name[0xb] = '\0';
    *(undefined1 *)&pmVar7[0x1a].capabilities = 0x11;
    pmVar7[0x1a].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x1a].capabilities.field_0x1 = 0;
    pmVar7[0x1a].spi.mux_total = 0;
  }
  if (0x1b < board->phy_pin_count) {
    pmVar7 = board->pins;
    pmVar7[0x1b].name[8] = '\0';
    pmVar7[0x1b].name[9] = '\0';
    pmVar7[0x1b].name[10] = '\0';
    pmVar7[0x1b].name[0xb] = '\0';
    pmVar7[0x1b].name[0] = 'I';
    pmVar7[0x1b].name[1] = '2';
    pmVar7[0x1b].name[2] = 'C';
    pmVar7[0x1b].name[3] = '1';
    pmVar7[0x1b].name[4] = '_';
    pmVar7[0x1b].name[5] = 'D';
    pmVar7[0x1b].name[6] = 'A';
    pmVar7[0x1b].name[7] = 'T';
    *(undefined1 *)&pmVar7[0x1b].capabilities = 0x21;
    pmVar7[0x1b].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x1b].capabilities.field_0x1 = 0;
    pmVar7[0x1b].i2c.pinmap = 1;
    pmVar7[0x1b].i2c.mux_total = 0;
  }
  if (0x1c < board->phy_pin_count) {
    pmVar7 = board->pins;
    pmVar7[0x1c].name[8] = '\0';
    pmVar7[0x1c].name[9] = '\0';
    pmVar7[0x1c].name[10] = '\0';
    pmVar7[0x1c].name[0xb] = '\0';
    pmVar7[0x1c].name[0] = 'I';
    pmVar7[0x1c].name[1] = '2';
    pmVar7[0x1c].name[2] = 'C';
    pmVar7[0x1c].name[3] = '1';
    pmVar7[0x1c].name[4] = '_';
    pmVar7[0x1c].name[5] = 'C';
    pmVar7[0x1c].name[6] = 'K';
    pmVar7[0x1c].name[7] = '\0';
    *(undefined1 *)&pmVar7[0x1c].capabilities = 0x21;
    pmVar7[0x1c].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x1c].capabilities.field_0x1 = 0;
    pmVar7[0x1c].i2c.pinmap = 1;
    pmVar7[0x1c].i2c.mux_total = 0;
  }
  iVar1 = base2;
  if (0x1d < board->phy_pin_count) {
    pmVar7 = board->pins;
    pmVar7[0x1d].name[8] = '\0';
    pmVar7[0x1d].name[9] = '\0';
    pmVar7[0x1d].name[10] = '\0';
    pmVar7[0x1d].name[0xb] = '\0';
    pmVar7[0x1d].name[0] = 'G';
    pmVar7[0x1d].name[1] = 'P';
    pmVar7[0x1d].name[2] = 'I';
    pmVar7[0x1d].name[3] = 'O';
    pmVar7[0x1d].name[4] = '1';
    pmVar7[0x1d].name[5] = '_';
    pmVar7[0x1d].name[6] = '0';
    pmVar7[0x1d].name[7] = '\0';
    *(undefined1 *)&pmVar7[0x1d].capabilities = 7;
    pmVar7[0x1d].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x1d].capabilities.field_0x1 = 0;
    pmVar7[0x1d].gpio.pinmap = iVar1;
    pmVar7[0x1d].gpio.mux_total = 0;
  }
  pmVar7 = board->pins;
  pmVar7[0x1d].pwm.pinmap = 0;
  pmVar7[0x1d].pwm.parent_id = 1;
  board->pwm_dev_count = board->pwm_dev_count + 1;
  if (0x1e < board->phy_pin_count) {
    pmVar7[0x1e].name[8] = '\0';
    pmVar7[0x1e].name[9] = '\0';
    pmVar7[0x1e].name[10] = '\0';
    pmVar7[0x1e].name[0xb] = '\0';
    pmVar7[0x1e].name[0] = 'G';
    pmVar7[0x1e].name[1] = 'N';
    pmVar7[0x1e].name[2] = 'D';
    pmVar7[0x1e].name[3] = '\0';
    pmVar7[0x1e].name[4] = '\0';
    pmVar7[0x1e].name[5] = '\0';
    pmVar7[0x1e].name[6] = '\0';
    pmVar7[0x1e].name[7] = '\0';
    *(undefined1 *)&pmVar7[0x1e].capabilities = 1;
    pmVar7[0x1e].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x1e].capabilities.field_0x1 = 0;
  }
  if (0x1f < board->phy_pin_count) {
    iVar1 = base2 + 1;
    pmVar7 = board->pins;
    pmVar7[0x1f].name[8] = '\0';
    pmVar7[0x1f].name[9] = '\0';
    pmVar7[0x1f].name[10] = '\0';
    pmVar7[0x1f].name[0xb] = '\0';
    pmVar7[0x1f].name[0] = 'G';
    pmVar7[0x1f].name[1] = 'P';
    pmVar7[0x1f].name[2] = 'I';
    pmVar7[0x1f].name[3] = 'O';
    pmVar7[0x1f].name[4] = '1';
    pmVar7[0x1f].name[5] = '_';
    pmVar7[0x1f].name[6] = '1';
    pmVar7[0x1f].name[7] = '\0';
    *(undefined1 *)&pmVar7[0x1f].capabilities = 7;
    pmVar7[0x1f].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x1f].capabilities.field_0x1 = 0;
    pmVar7[0x1f].gpio.pinmap = iVar1;
    pmVar7[0x1f].gpio.mux_total = 0;
  }
  pmVar7 = board->pins;
  pmVar7[0x1f].pwm.pinmap = 1;
  pmVar7[0x1f].pwm.parent_id = 1;
  board->pwm_dev_count = board->pwm_dev_count + 1;
  if (0x20 < board->phy_pin_count) {
    iVar1 = base2 + 2;
    pmVar7[0x20].name[8] = '\0';
    pmVar7[0x20].name[9] = '\0';
    pmVar7[0x20].name[10] = '\0';
    pmVar7[0x20].name[0xb] = '\0';
    pmVar7[0x20].name[0] = 'G';
    pmVar7[0x20].name[1] = 'P';
    pmVar7[0x20].name[2] = 'I';
    pmVar7[0x20].name[3] = 'O';
    pmVar7[0x20].name[4] = '1';
    pmVar7[0x20].name[5] = '_';
    pmVar7[0x20].name[6] = '2';
    pmVar7[0x20].name[7] = '\0';
    *(undefined1 *)&pmVar7[0x20].capabilities = 7;
    pmVar7[0x20].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x20].capabilities.field_0x1 = 0;
    pmVar7[0x20].gpio.pinmap = iVar1;
    pmVar7[0x20].gpio.mux_total = 0;
  }
  pmVar7 = board->pins;
  pmVar7[0x20].pwm.pinmap = 2;
  pmVar7[0x20].pwm.parent_id = 1;
  board->pwm_dev_count = board->pwm_dev_count + 1;
  if (0x21 < board->phy_pin_count) {
    iVar1 = base2 + 3;
    pmVar7[0x21].name[8] = '\0';
    pmVar7[0x21].name[9] = '\0';
    pmVar7[0x21].name[10] = '\0';
    pmVar7[0x21].name[0xb] = '\0';
    pmVar7[0x21].name[0] = 'G';
    pmVar7[0x21].name[1] = 'P';
    pmVar7[0x21].name[2] = 'I';
    pmVar7[0x21].name[3] = 'O';
    pmVar7[0x21].name[4] = '1';
    pmVar7[0x21].name[5] = '_';
    pmVar7[0x21].name[6] = '3';
    pmVar7[0x21].name[7] = '\0';
    *(undefined1 *)&pmVar7[0x21].capabilities = 7;
    pmVar7[0x21].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x21].capabilities.field_0x1 = 0;
    pmVar7[0x21].gpio.pinmap = iVar1;
    pmVar7[0x21].gpio.mux_total = 0;
  }
  pmVar7 = board->pins;
  pmVar7[0x21].pwm.pinmap = 3;
  pmVar7[0x21].pwm.parent_id = 1;
  board->pwm_dev_count = board->pwm_dev_count + 1;
  if (0x22 < board->phy_pin_count) {
    pmVar7[0x22].name[8] = '\0';
    pmVar7[0x22].name[9] = '\0';
    pmVar7[0x22].name[10] = '\0';
    pmVar7[0x22].name[0xb] = '\0';
    pmVar7[0x22].name[0] = 'G';
    pmVar7[0x22].name[1] = 'N';
    pmVar7[0x22].name[2] = 'D';
    pmVar7[0x22].name[3] = '\0';
    pmVar7[0x22].name[4] = '\0';
    pmVar7[0x22].name[5] = '\0';
    pmVar7[0x22].name[6] = '\0';
    pmVar7[0x22].name[7] = '\0';
    *(undefined1 *)&pmVar7[0x22].capabilities = 1;
    pmVar7[0x22].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x22].capabilities.field_0x1 = 0;
  }
  if (0x23 < board->phy_pin_count) {
    iVar1 = base2 + 4;
    pmVar7 = board->pins;
    pmVar7[0x23].name[8] = '\0';
    pmVar7[0x23].name[9] = '\0';
    pmVar7[0x23].name[10] = '\0';
    pmVar7[0x23].name[0xb] = '\0';
    pmVar7[0x23].name[0] = 'G';
    pmVar7[0x23].name[1] = 'P';
    pmVar7[0x23].name[2] = 'I';
    pmVar7[0x23].name[3] = 'O';
    pmVar7[0x23].name[4] = '1';
    pmVar7[0x23].name[5] = '_';
    pmVar7[0x23].name[6] = '4';
    pmVar7[0x23].name[7] = '\0';
    *(undefined1 *)&pmVar7[0x23].capabilities = 7;
    pmVar7[0x23].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x23].capabilities.field_0x1 = 0;
    pmVar7[0x23].gpio.pinmap = iVar1;
    pmVar7[0x23].gpio.mux_total = 0;
  }
  pmVar7 = board->pins;
  pmVar7[0x23].pwm.pinmap = 4;
  pmVar7[0x23].pwm.parent_id = 1;
  board->pwm_dev_count = board->pwm_dev_count + 1;
  if (0x24 < board->phy_pin_count) {
    iVar1 = base2 + 5;
    pmVar7[0x24].name[8] = '\0';
    pmVar7[0x24].name[9] = '\0';
    pmVar7[0x24].name[10] = '\0';
    pmVar7[0x24].name[0xb] = '\0';
    pmVar7[0x24].name[0] = 'G';
    pmVar7[0x24].name[1] = 'P';
    pmVar7[0x24].name[2] = 'I';
    pmVar7[0x24].name[3] = 'O';
    pmVar7[0x24].name[4] = '1';
    pmVar7[0x24].name[5] = '_';
    pmVar7[0x24].name[6] = '5';
    pmVar7[0x24].name[7] = '\0';
    *(undefined1 *)&pmVar7[0x24].capabilities = 7;
    pmVar7[0x24].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x24].capabilities.field_0x1 = 0;
    pmVar7[0x24].gpio.pinmap = iVar1;
    pmVar7[0x24].gpio.mux_total = 0;
  }
  pmVar7 = board->pins;
  pmVar7[0x24].pwm.pinmap = 5;
  pmVar7[0x24].pwm.parent_id = 1;
  board->pwm_dev_count = board->pwm_dev_count + 1;
  if (0x25 < board->phy_pin_count) {
    iVar1 = base2 + 6;
    pmVar7[0x25].name[8] = '\0';
    pmVar7[0x25].name[9] = '\0';
    pmVar7[0x25].name[10] = '\0';
    pmVar7[0x25].name[0xb] = '\0';
    pmVar7[0x25].name[0] = 'G';
    pmVar7[0x25].name[1] = 'P';
    pmVar7[0x25].name[2] = 'I';
    pmVar7[0x25].name[3] = 'O';
    pmVar7[0x25].name[4] = '1';
    pmVar7[0x25].name[5] = '_';
    pmVar7[0x25].name[6] = '6';
    pmVar7[0x25].name[7] = '\0';
    *(undefined1 *)&pmVar7[0x25].capabilities = 7;
    pmVar7[0x25].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x25].capabilities.field_0x1 = 0;
    pmVar7[0x25].gpio.pinmap = iVar1;
    pmVar7[0x25].gpio.mux_total = 0;
  }
  pmVar7 = board->pins;
  pmVar7[0x25].pwm.pinmap = 6;
  pmVar7[0x25].pwm.parent_id = 1;
  board->pwm_dev_count = board->pwm_dev_count + 1;
  if (0x26 < board->phy_pin_count) {
    iVar1 = base2 + 7;
    pmVar7[0x26].name[8] = '\0';
    pmVar7[0x26].name[9] = '\0';
    pmVar7[0x26].name[10] = '\0';
    pmVar7[0x26].name[0xb] = '\0';
    pmVar7[0x26].name[0] = 'G';
    pmVar7[0x26].name[1] = 'P';
    pmVar7[0x26].name[2] = 'I';
    pmVar7[0x26].name[3] = 'O';
    pmVar7[0x26].name[4] = '1';
    pmVar7[0x26].name[5] = '_';
    pmVar7[0x26].name[6] = '7';
    pmVar7[0x26].name[7] = '\0';
    *(undefined1 *)&pmVar7[0x26].capabilities = 7;
    pmVar7[0x26].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x26].capabilities.field_0x1 = 0;
    pmVar7[0x26].gpio.pinmap = iVar1;
    pmVar7[0x26].gpio.mux_total = 0;
  }
  pmVar7 = board->pins;
  pmVar7[0x26].pwm.pinmap = 7;
  pmVar7[0x26].pwm.parent_id = 1;
  board->pwm_dev_count = board->pwm_dev_count + 1;
  if (0x27 < board->phy_pin_count) {
    pmVar7[0x27].name[8] = '\0';
    pmVar7[0x27].name[9] = '\0';
    pmVar7[0x27].name[10] = '\0';
    pmVar7[0x27].name[0xb] = '\0';
    pmVar7[0x27].name[0] = 'G';
    pmVar7[0x27].name[1] = 'N';
    pmVar7[0x27].name[2] = 'D';
    pmVar7[0x27].name[3] = '\0';
    pmVar7[0x27].name[4] = '\0';
    pmVar7[0x27].name[5] = '\0';
    pmVar7[0x27].name[6] = '\0';
    pmVar7[0x27].name[7] = '\0';
    *(undefined1 *)&pmVar7[0x27].capabilities = 1;
    pmVar7[0x27].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x27].capabilities.field_0x1 = 0;
  }
  if (0x28 < board->phy_pin_count) {
    iVar1 = base2 + 8;
    pmVar7 = board->pins;
    pmVar7[0x28].name[8] = '\0';
    pmVar7[0x28].name[9] = '\0';
    pmVar7[0x28].name[10] = '\0';
    pmVar7[0x28].name[0xb] = '\0';
    pmVar7[0x28].name[0] = 'G';
    pmVar7[0x28].name[1] = 'P';
    pmVar7[0x28].name[2] = 'I';
    pmVar7[0x28].name[3] = 'O';
    pmVar7[0x28].name[4] = '2';
    pmVar7[0x28].name[5] = '_';
    pmVar7[0x28].name[6] = '8';
    pmVar7[0x28].name[7] = '\0';
    *(undefined1 *)&pmVar7[0x28].capabilities = 7;
    pmVar7[0x28].capabilities.field_0x3 = 0;
    *(undefined2 *)&pmVar7[0x28].capabilities.field_0x1 = 0;
    pmVar7[0x28].gpio.pinmap = iVar1;
    pmVar7[0x28].gpio.mux_total = 0;
  }
  pmVar7 = board->pins;
  pmVar7[0x28].pwm.pinmap = 8;
  pmVar7[0x28].pwm.parent_id = 1;
  board->pwm_dev_count = board->pwm_dev_count + 1;
  board->uart_dev_count = 1;
  mraa_lec_al_get_pin_index(board,"UART_RXD",&board->uart_dev[0].rx);
  mraa_lec_al_get_pin_index(board,"UART_TXD",&board->uart_dev[0].tx);
  board->uart_dev[0].device_path = "/dev/ttyS4";
  board->def_uart_dev = 0;
  board->spi_bus_count = 0;
  board->spi_bus[0].bus_id = 1;
  board->spi_bus[0].slave_s = 0;
  mraa_lec_al_get_pin_index(board,"SPI_0_CE0",&board->spi_bus[0].cs);
  mraa_lec_al_get_pin_index(board,"SPI_0_MOSI",&board->spi_bus[board->spi_bus_count].mosi);
  mraa_lec_al_get_pin_index(board,"SPI_0_MISO",&board->spi_bus[board->spi_bus_count].miso);
  mraa_lec_al_get_pin_index(board,"SPI_0_SCLK",&board->spi_bus[board->spi_bus_count].sclk);
  iVar1 = board->spi_bus_count;
  board->spi_bus_count = iVar1 + 1;
  board->spi_bus[(long)iVar1 + 1].bus_id = 1;
  board->spi_bus[(long)iVar1 + 1].slave_s = 1;
  mraa_lec_al_get_pin_index(board,"SPI_0_CE1",&board->spi_bus[(long)iVar1 + 1].cs);
  mraa_lec_al_get_pin_index(board,"SPI_0_MOSI",&board->spi_bus[board->spi_bus_count].mosi);
  mraa_lec_al_get_pin_index(board,"SPI_0_MISO",&board->spi_bus[board->spi_bus_count].miso);
  mraa_lec_al_get_pin_index(board,"SPI_0_SCLK",&board->spi_bus[board->spi_bus_count].sclk);
  board->spi_bus_count = board->spi_bus_count + 1;
  board->i2c_bus_count = 0;
  board->def_i2c_bus = 0;
  uVar11 = mraa_find_i2c_bus_pci("0000:00","0000:00:16.1","i2c_designware.1");
  uVar10 = local_9c;
  if (uVar11 != 0xffffffff) {
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    snprintf((char *)&local_98,0x14,"/dev/i2c-%d",(ulong)uVar11);
    _fd = open((char *)&local_98,2);
    if ((_fd < 0) || (iVar1 = ioctl(_fd,0x706,0x3e), iVar1 < 0)) {
LAB_001210ac:
      _fd = -1;
    }
    else {
      local_98 = CONCAT71(local_98._1_7_,0x1e);
      sVar9 = write(_fd,&local_98,1);
      if (sVar9 != 1) goto LAB_001210ac;
      sVar9 = read(_fd,(void *)((long)&local_98 + 1),1);
      if (sVar9 == 1) {
        local_98 = local_98 | 0xdf00;
        sVar9 = write(_fd,&local_98,2);
        if (sVar9 != 2) goto LAB_001210ac;
      }
      local_98 = CONCAT71(local_98._1_7_,0x1f);
      sVar9 = write(_fd,&local_98,1);
      if ((sVar9 != 1) || (sVar9 = read(_fd,(void *)((long)&local_98 + 1),1), sVar9 != 1))
      goto LAB_001210ac;
      local_98 = local_98 & 0xffffffffffff07ff | 0x1000;
      sVar9 = write(_fd,&local_98,2);
      if (sVar9 != 2) goto LAB_001210ac;
    }
    board->i2c_bus[0].bus_id = uVar11;
    mraa_lec_al_get_pin_index(board,"I2C1_DAT",&board->i2c_bus[1].sda);
    mraa_lec_al_get_pin_index(board,"I2C1_CK",&board->i2c_bus[1].scl);
    board->i2c_bus_count = board->i2c_bus_count + 1;
  }
  if (uVar10 == 0) {
    pcVar12 = "0000:00:1f.1";
    pcVar6 = ".";
  }
  else {
    if (uVar10 != 1) goto LAB_00121155;
    pcVar12 = "0000:00:16.3";
    pcVar6 = "i2c_designware.3";
  }
  uVar11 = mraa_find_i2c_bus_pci("0000:00",pcVar12,pcVar6);
LAB_00121155:
  if (uVar11 != 0xffffffff) {
    board->i2c_bus[1].bus_id = uVar11;
    mraa_lec_al_get_pin_index(board,"I2C0_DAT",&board->i2c_bus[0].sda);
    mraa_lec_al_get_pin_index(board,"I2C0_CK",&board->i2c_bus[0].scl);
    board->i2c_bus_count = board->i2c_bus_count + 1;
  }
  iVar1 = access("/sys/bus/platform/drivers/broxton-pinctrl",0);
  pcVar6 = "";
  if (iVar1 == -1) {
    pcVar6 = "un";
  }
  syslog(5,"lec_al: kernel pinctrl driver %savailable",pcVar6);
  return board;
}

Assistant:

mraa_board_t* mraa_lec_al_board()
{
	int i, fd, i2c_bus_num;
	int lecalai  = -1;
	char buffer[60] = {0}, *line = NULL;
	FILE *fh;
	size_t len;

	mraa_board_t* b = (mraa_board_t*) calloc(1, sizeof (mraa_board_t));

	if (b == NULL) {
		return NULL;
	}

	if((fh = fopen("/sys/devices/virtual/dmi/id/product_name", "r")) != NULL) {
		if (getline(&line, &len, fh) != -1) {
			line[strcspn(line, "\r\n")] = 0;
			if ((strncasecmp(line, "LEC-AL-AI", strlen("LEC-AL-AI") + 1) == 0)\
				       || (strncasecmp(line, "LEC-ALAI", strlen("LEC-ALAI") + 1) == 0)) {
				b->platform_name = PLATFORM_NAME_AI;
				lecalai = 1;
			}
			else
			{
				lecalai = 0;
				b->platform_name = PLATFORM_NAME;
			}
		}
		fclose(fh);
	}

	b->phy_pin_count = MRAA_LEC_AL_PINCOUNT;
	b->gpio_count = MRAA_LEC_AL_GPIOCOUNT;
	b->chardev_capable = 0;

	b->pins = (mraa_pininfo_t*) malloc(sizeof(mraa_pininfo_t) * MRAA_LEC_AL_PINCOUNT);
	if (b->pins == NULL) {
		goto error;
	}

	b->adv_func = (mraa_adv_func_t *) calloc(1, sizeof (mraa_adv_func_t));
	if (b->adv_func == NULL) {
		free(b->pins);
		goto error;
	}

	b->adv_func->gpio_isr_replace = gpio_isr_replace;
	b->adv_func->gpio_close_pre = gpio_close_pre;
	b->adv_func->gpio_init_pre = gpio_init_pre;

	// initializations of pwm functions
	b->adv_func->pwm_init_raw_replace = pwm_init_raw_replace;
	b->adv_func->pwm_period_replace = pwm_period_replace;
	b->adv_func->pwm_read_replace = pwm_read_replace;
	b->adv_func->pwm_write_replace = pwm_write_replace;
	b->adv_func->pwm_enable_replace = pwm_enable_replace;

	for(i = 0; i < 999; i++)
	{
		snprintf(buffer, sizeof(buffer), "/sys/class/gpio/gpiochip%d/device/name",i);
		if((fd = open(buffer, O_RDONLY)) != -1)
		{
			int count = read(fd,buffer,7);
			if(count != 0)
			{
				if(strncmp(buffer, "sx1509q", count) == 0)
				{
					base2 = i;
				}
				if(strncmp(buffer, "pca9535", count) == 0)
				{
					base1 = i;
				}
			}
			close(fd);
		}
	}

	syslog(LOG_NOTICE, "lec_al: base1 %d base2 %d\n", base1, base2);

	// Configure PWM
	b->pwm_dev_count = 0;
	b->pwm_default_period = 5000;
	b->pwm_max_period = 218453;
	b->pwm_min_period = 1;

	mraa_lec_al_set_pininfo(b, 1,  "3v3",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 2,  "5v",         (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 3,  "I2C0_DAT",   (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 4,  "5v",         (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 5,  "I2C0_CK",    (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 6,  "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 7,  "GPIO04",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 4);
	mraa_lec_al_set_pininfo(b, 8,  "UART_TXD",   (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 1 }, -1);
	mraa_lec_al_set_pininfo(b, 9,  "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 10, "UART_RXD",   (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 1 }, -1);
	mraa_lec_al_set_pininfo(b, 11, "GPIO05",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 6);
	mraa_lec_al_set_pininfo(b, 12, "GPIO06",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 5);
	b->pins[12].pwm.parent_id = 0;
	b->pins[12].pwm.pinmap = 9;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 13, "GPIO07",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 7);
	mraa_lec_al_set_pininfo(b, 14, "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 15, "GPIO08",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 8);
	mraa_lec_al_set_pininfo(b, 16, "GPIO09",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 9);
	mraa_lec_al_set_pininfo(b, 17, "3v3",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 18, "GPIO10",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 10);
	mraa_lec_al_set_pininfo(b, 19, "SPI_0_MOSI", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 20, "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 21, "SPI_0_MISO", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 22, "GPIO11",     (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, base1 + 11);
	mraa_lec_al_set_pininfo(b, 23, "SPI_0_SCLK", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 24, "SPI_0_CE0",  (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 25, "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 26, "SPI_0_CE1",  (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 27, "I2C1_DAT",   (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 28, "I2C1_CK",    (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 }, -1);

	mraa_lec_al_set_pininfo(b, 29, "GPIO1_0",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 0);
	b->pins[29].pwm.parent_id = 1;
	b->pins[29].pwm.pinmap = 0;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 30, "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 31, "GPIO1_1",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 1);
	b->pins[31].pwm.parent_id = 1;
	b->pins[31].pwm.pinmap = 1;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 32, "GPIO1_2",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 2);
	b->pins[32].pwm.parent_id = 1;
	b->pins[32].pwm.pinmap = 2;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 33, "GPIO1_3",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 3);
	b->pins[33].pwm.parent_id = 1;
	b->pins[33].pwm.pinmap = 3;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 34, "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 35, "GPIO1_4",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 4);
	b->pins[35].pwm.parent_id = 1;
	b->pins[35].pwm.pinmap = 4;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 36, "GPIO1_5",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 5);
	b->pins[36].pwm.parent_id = 1;
	b->pins[36].pwm.pinmap = 5;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 37, "GPIO1_6",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 6);
	b->pins[37].pwm.parent_id = 1;
	b->pins[37].pwm.pinmap = 6;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 38, "GPIO1_7",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 7);
	b->pins[38].pwm.parent_id = 1;
	b->pins[38].pwm.pinmap = 7;
	b->pwm_dev_count++;
	mraa_lec_al_set_pininfo(b, 39, "GND",        (mraa_pincapabilities_t){ -1, 0, 0, 0, 0, 0, 0, 0 }, -1);
	mraa_lec_al_set_pininfo(b, 40, "GPIO2_8",    (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 }, base2 + 8);
	b->pins[40].pwm.parent_id = 1;
	b->pins[40].pwm.pinmap = 8;
	b->pwm_dev_count++;


	// Configure UART #1 (default)
	b->uart_dev_count = 1;

	mraa_lec_al_get_pin_index(b, "UART_RXD",  &(b->uart_dev[0].rx));
	mraa_lec_al_get_pin_index(b, "UART_TXD",  &(b->uart_dev[0].tx));
	b->uart_dev[0].device_path = "/dev/ttyS4";

	b->def_uart_dev = 0;

	// Configure SPI #0 CS1
	b->spi_bus_count = 0;
	b->spi_bus[b->spi_bus_count].bus_id = 1;
	b->spi_bus[b->spi_bus_count].slave_s = 0;
	mraa_lec_al_get_pin_index(b, "SPI_0_CE0",  &(b->spi_bus[b->spi_bus_count].cs));
	mraa_lec_al_get_pin_index(b, "SPI_0_MOSI", &(b->spi_bus[b->spi_bus_count].mosi));
	mraa_lec_al_get_pin_index(b, "SPI_0_MISO", &(b->spi_bus[b->spi_bus_count].miso));
	mraa_lec_al_get_pin_index(b, "SPI_0_SCLK",  &(b->spi_bus[b->spi_bus_count].sclk));
	b->spi_bus_count++;

	b->spi_bus[b->spi_bus_count].bus_id = 1;
	b->spi_bus[b->spi_bus_count].slave_s = 1;
	mraa_lec_al_get_pin_index(b, "SPI_0_CE1",  &(b->spi_bus[b->spi_bus_count].cs));
	mraa_lec_al_get_pin_index(b, "SPI_0_MOSI", &(b->spi_bus[b->spi_bus_count].mosi));
	mraa_lec_al_get_pin_index(b, "SPI_0_MISO", &(b->spi_bus[b->spi_bus_count].miso));
	mraa_lec_al_get_pin_index(b, "SPI_0_SCLK",  &(b->spi_bus[b->spi_bus_count].sclk));
	b->spi_bus_count++;

	// Set number of i2c adaptors usable from userspace
	b->i2c_bus_count = 0;
	b->def_i2c_bus = 0;

	i2c_bus_num = mraa_find_i2c_bus_pci("0000:00", "0000:00:16.1", "i2c_designware.1");
	if (i2c_bus_num != -1) {
		if(sx150x_init(i2c_bus_num) < 0)
		{
			_fd = -1;
		}

		b->i2c_bus[0].bus_id = i2c_bus_num;
		mraa_lec_al_get_pin_index(b, "I2C1_DAT", (int*) &(b->i2c_bus[1].sda));
		mraa_lec_al_get_pin_index(b, "I2C1_CK", (int*) &(b->i2c_bus[1].scl));
		b->i2c_bus_count++;
	}

	if(lecalai == 1)
	{
		i2c_bus_num = mraa_find_i2c_bus_pci("0000:00", "0000:00:16.3", "i2c_designware.3");
	}
	else if(lecalai == 0)
	{
		i2c_bus_num = mraa_find_i2c_bus_pci("0000:00", "0000:00:1f.1", ".");
	}
	if (i2c_bus_num != -1) {
		b->i2c_bus[1].bus_id = i2c_bus_num;
		mraa_lec_al_get_pin_index(b, "I2C0_DAT", (int*) &(b->i2c_bus[0].sda));
		mraa_lec_al_get_pin_index(b, "I2C0_CK", (int*) &(b->i2c_bus[0].scl));
		b->i2c_bus_count++;
	}

	const char* pinctrl_path = "/sys/bus/platform/drivers/broxton-pinctrl";
	int have_pinctrl = access(pinctrl_path, F_OK) != -1;
	syslog(LOG_NOTICE, "lec_al: kernel pinctrl driver %savailable", have_pinctrl ? "" : "un");

	return b;

error:
	syslog(LOG_CRIT, "lec_al: Platform failed to initialise");
	free(b);
	close(_fd);
	return NULL;
}